

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidUpsampleAlignCorners(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *this_00;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  PoolingLayerParams *pPVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  UpsampleLayerParams *pUVar14;
  unsigned_long *puVar15;
  Model *pMVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  uint uVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  uint32_t size;
  uint uVar21;
  Arena *pAVar22;
  Model m1;
  Model mlmodel;
  Result res;
  Model local_a0;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _func_int **local_48;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  CoreML::Specification::Model::Model(&local_a0,(Arena *)0x0,false);
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_a0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019c7de:
    pRVar20 = &(local_a0.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0019c7de;
    ((local_a0.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar3->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar18);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  this = &pAVar8->shape_;
  uVar19 = (pAVar8->shape_).current_size_;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar19 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar19] = 5;
  uVar21 = uVar19 + 1;
  (pAVar8->shape_).current_size_ = uVar21;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar21 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar21] = 5;
  uVar21 = uVar19 + 2;
  (pAVar8->shape_).current_size_ = uVar21;
  uVar2 = (pAVar8->shape_).total_size_;
  if (uVar21 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar21] = 5;
  this->current_size_ = uVar19 + 3;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_a0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019c94a:
    pRVar20 = &(local_a0.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0019c94a;
    ((local_a0.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar3->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"probs",puVar18);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (local_a0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_a0);
    local_a0._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(local_a0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_a0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_a0.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  (local_a0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_a0.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019ca43:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_a0.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar11);
  }
  else {
    iVar1 = (local_a0.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0019ca43;
    (local_a0.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  pRVar3 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019ca7b:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar1 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0019ca7b;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3cb973);
  pRVar3 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019cacb:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar1 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0019cacb;
    (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3b872d);
  if (pNVar11->_oneof_case_[0] != 0xd2) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0xd2;
    uVar4 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pUVar14 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::UpsampleLayerParams>(pAVar22);
    (pNVar11->layer_).upsample_ = pUVar14;
  }
  pPVar5 = (pNVar11->layer_).pooling_;
  this_00 = &pPVar5->kernelsize_;
  uVar19 = (pPVar5->kernelsize_).current_size_;
  uVar2 = (pPVar5->kernelsize_).total_size_;
  if (uVar19 == uVar2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
  }
  puVar15 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar15[uVar19] = 1;
  uVar21 = uVar19 + 1;
  (pPVar5->kernelsize_).current_size_ = uVar21;
  uVar2 = (pPVar5->kernelsize_).total_size_;
  if (uVar21 == uVar2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
  }
  puVar15 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar15[uVar21] = 1;
  (pPVar5->kernelsize_).current_size_ = uVar19 + 2;
  pPVar5->_stride_cached_byte_size_ = (__atomic_base<int>)0x1;
  pPVar5->type_ = 2;
  CoreML::validate<(MLModelType)500>((Result *)&local_48,&local_a0);
  bVar6 = CoreML::Result::good((Result *)&local_48);
  if (bVar6) {
    pPVar5->type_ = 1;
    CoreML::validate<(MLModelType)500>((Result *)local_70,&local_a0);
    local_48 = (_func_int **)local_70;
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    bVar6 = CoreML::Result::good((Result *)&local_48);
    if (bVar6) {
      CoreML::Model::Model((Model *)local_70,&local_a0);
      pMVar16 = CoreML::Model::getProto((Model *)local_70);
      bVar6 = pMVar16->specificationversion_ != 5;
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc6d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,
                   "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14"
                   ,0x50);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
      }
      uVar19 = (uint)bVar6;
      CoreML::Model::~Model((Model *)local_70);
      goto LAB_0019ce51;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc69);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  std::ostream::put((char)poVar17);
  uVar19 = 1;
  std::ostream::flush();
LAB_0019ce51:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_a0);
  return uVar19;
}

Assistant:

int testValidUpsampleAlignCorners() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    // Scaling factor needs to be 2D
    params->add_scalingfactor(1.0);
    params->add_scalingfactor(1.0);

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode_BILINEAR);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);

    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Check that the new field sets spec version to ios 14
    Model mlmodel = Model(m1);
    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14);
    return 0;
}